

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void er_draw(vector<cv::Mat,_std::allocator<cv::Mat>_> *channels,
            vector<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
            *regions,vector<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_> *group,
            Mat *segmentation)

{
  int iVar1;
  int iVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pMVar4;
  pointer pVVar5;
  long lVar6;
  long lVar7;
  int local_e0;
  int local_dc;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *local_d8;
  Mat *local_d0;
  undefined4 local_c8 [2];
  Mat *local_c0;
  undefined8 uStack_b8;
  undefined4 local_b0 [2];
  pointer local_a8;
  undefined8 uStack_a0;
  double local_98 [13];
  
  pVVar5 = (group->super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(group->
                              super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5) >> 3)) {
    lVar6 = 0;
    local_d8 = channels;
    local_d0 = segmentation;
    do {
      lVar3 = *(long *)&(regions->
                        super__Vector_base<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>,_std::allocator<std::vector<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start
                        [pVVar5[lVar6].super_Matx<int,_2,_1>.val[0]].
                        super__Vector_base<cv::text::ERStat,_std::allocator<cv::text::ERStat>_>.
                        _M_impl.super__Vector_impl_data;
      lVar7 = (long)pVVar5[lVar6].super_Matx<int,_2,_1>.val[1] * 0xb8;
      iVar1 = *(int *)(lVar3 + lVar7);
      iVar2 = *(int *)(lVar3 + 4 + lVar7);
      this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x58 + lVar7);
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(this + 8) = *(int *)(this + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(this + 8) = *(int *)(this + 8) + 1;
        }
      }
      if (*(long *)(lVar3 + lVar7 + 0x80) != 0) {
        pVVar5 = (group->super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pMVar4 = (local_d8->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_a8 = pMVar4 + (long)pVVar5[lVar6].super_Matx<int,_2,_1>.val[0] * 0x60;
        uStack_a0 = 0;
        local_b0[0] = 0x3010000;
        uStack_b8 = 0;
        local_c8[0] = 0x3010000;
        local_c0 = local_d0;
        local_e0 = *(int *)(pMVar4 + (long)pVVar5[lVar6].super_Matx<int,_2,_1>.val[0] * 0x60 + 0xc);
        local_dc = iVar1 / local_e0;
        local_e0 = iVar1 % local_e0;
        local_98[0] = (double)iVar2;
        local_98[4] = 255.0;
        local_98[7] = 0.0;
        local_98[5] = 0.0;
        local_98[6] = 0.0;
        local_98[3] = 0.0;
        local_98[1] = 0.0;
        local_98[2] = 0.0;
        local_98[10] = 0.0;
        local_98[0xb] = 0.0;
        local_98[8] = 0.0;
        local_98[9] = 0.0;
        cv::floodFill(local_b0,local_c8,&local_e0,local_98 + 4,0,local_98,local_98 + 8,0x3ff04);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      lVar6 = lVar6 + 1;
      pVVar5 = (group->super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (lVar6 < (int)((ulong)((long)(group->
                                         super__Vector_base<cv::Vec<int,_2>,_std::allocator<cv::Vec<int,_2>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar5)
                          >> 3));
  }
  return;
}

Assistant:

void er_draw(vector<Mat> &channels, vector<vector<ERStat> > &regions, vector<Vec2i> group, Mat& segmentation)
{
    for (int r=0; r<(int)group.size(); r++)
    {
        ERStat er = regions[group[r][0]][group[r][1]];
        if (er.parent != NULL) // deprecate the root region
        {
            int newMaskVal = 255;
            int flags = 4 + (newMaskVal << 8) + FLOODFILL_FIXED_RANGE + FLOODFILL_MASK_ONLY;
            floodFill(channels[group[r][0]],segmentation,Point(er.pixel%channels[group[r][0]].cols,er.pixel/channels[group[r][0]].cols),
                      Scalar(255),0,Scalar(er.level),Scalar(0),flags);
        }
    }
}